

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Span<int> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<int>
          (SmData *this,Span<int> *in,vector<int,_std::allocator<int>_> *out)

{
  pointer piVar1;
  Lit_t *pLVar2;
  Lit_t *pLVar3;
  Span<int> SVar4;
  Lit_t local_2c;
  
  piVar1 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  pLVar2 = in->first;
  for (pLVar3 = pLVar2; pLVar3 != pLVar2 + in->size; pLVar3 = pLVar3 + 1) {
    local_2c = mapLit(this,*pLVar3);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(out,&local_2c);
    pLVar2 = in->first;
  }
  SVar4 = toSpan<std::vector<int,std::allocator<int>>>(out);
  return SVar4;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}